

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_heart_Printer.h
# Opt level: O3

void __thiscall
soul::heart::Printer::PrinterStream::printVarWithPrefix(PrinterStream *this,string *name)

{
  char *pcVar1;
  CodePrinter *this_00;
  pointer pcVar2;
  string_view text;
  string_view text_00;
  string_view text_01;
  string local_60;
  string local_40;
  
  if (name->_M_string_length == 0) {
    throwInternalCompilerError("! name.empty()","printVarWithPrefix",0x200);
  }
  pcVar1 = (name->_M_dataplus)._M_p;
  this_00 = this->out;
  if (*pcVar1 == '$') {
    text._M_str = pcVar1;
    text._M_len = name->_M_string_length;
    choc::text::CodePrinter::writeBlock(this_00,text);
    return;
  }
  text_00._M_str = "$";
  text_00._M_len = 1;
  choc::text::CodePrinter::writeBlock(this_00,text_00);
  pcVar2 = (name->_M_dataplus)._M_p;
  local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_60,pcVar2,pcVar2 + name->_M_string_length);
  removeCharacter(&local_40,&local_60,'$');
  text_01._M_str = local_40._M_dataplus._M_p;
  text_01._M_len = local_40._M_string_length;
  choc::text::CodePrinter::writeBlock(this_00,text_01);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != &local_60.field_2) {
    operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void printVarWithPrefix (const std::string& name)
        {
            SOUL_ASSERT (! name.empty());

            if (name[0] == '$')
                out << name;
            else
                out << "$" << removeCharacter (name, '$');
        }